

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

uint64_t fletcher4(char *key,int len,uint64_t seed)

{
  uint64_t uVar1;
  long lVar2;
  uint32_t *dataw;
  long lVar3;
  uint8_t *datac;
  uint *puVar4;
  
  lVar3 = 0;
  lVar2 = 0;
  uVar1 = 0;
  for (puVar4 = (uint *)key; puVar4 < key + (long)(len / 4) * 4; puVar4 = puVar4 + 1) {
    seed = seed + *puVar4;
    lVar2 = lVar2 + seed;
    lVar3 = lVar3 + lVar2;
    uVar1 = uVar1 + lVar3;
  }
  if ((len & 3U) != 0) {
    for (; puVar4 < key + len; puVar4 = (uint *)((long)puVar4 + 1)) {
      seed = seed + (byte)*puVar4;
      lVar2 = lVar2 + seed;
      lVar3 = lVar3 + lVar2;
      uVar1 = uVar1 + lVar3;
    }
  }
  return uVar1;
}

Assistant:

uint64_t
fletcher4(const char *key, int len, uint64_t seed)
{
  uint32_t *dataw = (uint32_t *)key;
  const uint32_t *const endw = &((const uint32_t*)key)[len/4];
  uint64_t A = seed, B = 0, C = 0, D = 0;
  while (dataw < endw) {
    A += *dataw++;
    B += A;
    C += B;
    D += C;
  }
  if (len & 3) {
    uint8_t *datac = (uint8_t*)dataw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (datac < endc) {
      A += *datac++;
      B += A;
      C += B;
      D += C;
    }
  }
  return D;
}